

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

string * __thiscall
CodeGen::generateEnumType_abi_cxx11_(string *__return_storage_ptr__,CodeGen *this,NodePtr *n)

{
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  
  iVar2 = (*n->px->_vptr_Node[3])();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,
             *(long *)(CONCAT44(extraout_var,iVar2) + 0x28) + lVar1);
  poVar4 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"enum ",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," {\n",3);
  iVar2 = (*n->px->_vptr_Node[7])();
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    uVar5 = 0;
    do {
      poVar4 = this->os_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
      iVar3 = (*n->px->_vptr_Node[8])(n->px,uVar5 & 0xffffffff);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)CONCAT44(extraout_var_01,iVar3),
                          ((undefined8 *)CONCAT44(extraout_var_01,iVar3))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",\n",2);
      uVar5 = uVar5 + 1;
    } while (CONCAT44(extraout_var_00,iVar2) != uVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,"};\n\n",4);
  return __return_storage_ptr__;
}

Assistant:

string CodeGen::generateEnumType(const NodePtr& n)
{
    string s = decorate(n->name());
    os_ << "enum " << s << " {\n";
    size_t c = n->names();
    for (size_t i = 0; i < c; ++i) {
        os_ << "    " << n->nameAt(i) << ",\n";
    }
    os_ << "};\n\n";
    return s;
}